

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O3

void lib::string::RegisterLibString(State *state)

{
  Library lib;
  TableMemberReg string [7];
  Library LStack_c8;
  TableMemberReg local_b8;
  char *local_a0;
  code *local_98;
  undefined4 local_90;
  char *local_88;
  code *local_80;
  undefined4 local_78;
  char *local_70;
  code *local_68;
  undefined4 local_60;
  char *local_58;
  code *local_50;
  undefined4 local_48;
  char *local_40;
  code *local_38;
  undefined4 local_30;
  char *local_28;
  code *local_20;
  undefined4 local_18;
  
  luna::Library::Library(&LStack_c8,state);
  local_b8.name_ = "byte";
  local_b8.field_1.func_ = Byte;
  local_b8.type_ = ValueT_CFunction;
  local_a0 = "char";
  local_98 = Char;
  local_90 = 9;
  local_88 = "len";
  local_80 = Len;
  local_78 = 9;
  local_70 = "lower";
  local_68 = Lower;
  local_60 = 9;
  local_58 = "reverse";
  local_50 = Reverse;
  local_48 = 9;
  local_40 = "sub";
  local_38 = Sub;
  local_30 = 9;
  local_28 = "upper";
  local_20 = Upper;
  local_18 = 9;
  luna::Library::RegisterTableFunction(&LStack_c8,"string",&local_b8,7);
  return;
}

Assistant:

void RegisterLibString(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg string[] = {
            { "byte", Byte },
            { "char", Char },
            { "len", Len },
            { "lower", Lower },
            { "reverse", Reverse },
            { "sub", Sub },
            { "upper", Upper }
        };
        lib.RegisterTableFunction("string", string);
    }